

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWriteBMP(FILE *fout,WebPDecBuffer *buffer)

{
  size_t sVar1;
  long in_RSI;
  FILE *in_RDI;
  uint8_t zeroes [3];
  uint8_t bmp_header [54];
  uint32_t total_size;
  uint32_t bmp_stride;
  uint32_t line_size;
  uint32_t y;
  uint32_t bytes_per_px;
  int stride;
  uint8_t *rgba;
  uint32_t height;
  uint32_t width;
  int has_alpha;
  uint32_t in_stack_ffffffffffffff6c;
  uint8_t *in_stack_ffffffffffffff70;
  uint8_t local_88 [26];
  uint8_t auStack_6e [2];
  uint8_t auStack_6c [36];
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  void *local_30;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  FILE *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1c = WebPIsAlphaMode(MODE_RGB);
  local_20 = *(int *)(local_18 + 4);
  local_24 = *(uint *)(local_18 + 8);
  local_30 = *(void **)(local_18 + 0x10);
  local_34 = *(int *)(local_18 + 0x18);
  local_38 = 3;
  if (local_1c != 0) {
    local_38 = 4;
  }
  local_40 = local_38 * local_20;
  local_44 = local_40 + 3 & 0xfffffffc;
  local_48 = local_44 * local_24 + 0x36;
  memset(local_88,0,0x36);
  if (((local_10 == (FILE *)0x0) || (local_18 == 0)) || (local_30 == (void *)0x0)) {
    local_4 = 0;
  }
  else {
    PutLE16(local_88,0x4d42);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE16(auStack_6e,1);
    PutLE16(auStack_6c,local_38 << 3);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    PutLE32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    sVar1 = fwrite(local_88,0x36,1,local_10);
    if (sVar1 == 1) {
      for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
        sVar1 = fwrite(local_30,(ulong)local_40,1,local_10);
        if (sVar1 != 1) {
          return 0;
        }
        if (local_44 != local_40) {
          memset(&stack0xffffffffffffff75,0,3);
          sVar1 = fwrite(&stack0xffffffffffffff75,(ulong)(local_44 - local_40),1,local_10);
          if (sVar1 != 1) {
            return 0;
          }
        }
        local_30 = (void *)((long)local_30 + (long)local_34);
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int WebPWriteBMP(FILE* fout, const WebPDecBuffer* const buffer) {
  const int has_alpha = WebPIsAlphaMode(buffer->colorspace);
  const uint32_t width = buffer->width;
  const uint32_t height = buffer->height;
  const uint8_t* rgba = buffer->u.RGBA.rgba;
  const int stride = buffer->u.RGBA.stride;
  const uint32_t bytes_per_px = has_alpha ? 4 : 3;
  uint32_t y;
  const uint32_t line_size = bytes_per_px * width;
  const uint32_t bmp_stride = (line_size + 3) & ~3;   // pad to 4
  const uint32_t total_size = bmp_stride * height + BMP_HEADER_SIZE;
  uint8_t bmp_header[BMP_HEADER_SIZE] = { 0 };

  if (fout == NULL || buffer == NULL || rgba == NULL) return 0;

  // bitmap file header
  PutLE16(bmp_header + 0, 0x4d42);                // signature 'BM'
  PutLE32(bmp_header + 2, total_size);            // size including header
  PutLE32(bmp_header + 6, 0);                     // reserved
  PutLE32(bmp_header + 10, BMP_HEADER_SIZE);      // offset to pixel array
  // bitmap info header
  PutLE32(bmp_header + 14, 40);                   // DIB header size
  PutLE32(bmp_header + 18, width);                // dimensions
  PutLE32(bmp_header + 22, -(int)height);         // vertical flip!
  PutLE16(bmp_header + 26, 1);                    // number of planes
  PutLE16(bmp_header + 28, bytes_per_px * 8);     // bits per pixel
  PutLE32(bmp_header + 30, 0);                    // no compression (BI_RGB)
  PutLE32(bmp_header + 34, 0);                    // image size (placeholder)
  PutLE32(bmp_header + 38, 2400);                 // x pixels/meter
  PutLE32(bmp_header + 42, 2400);                 // y pixels/meter
  PutLE32(bmp_header + 46, 0);                    // number of palette colors
  PutLE32(bmp_header + 50, 0);                    // important color count

  // TODO(skal): color profile

  // write header
  if (fwrite(bmp_header, sizeof(bmp_header), 1, fout) != 1) {
    return 0;
  }

  // write pixel array
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, line_size, 1, fout) != 1) {
      return 0;
    }
    // write padding zeroes
    if (bmp_stride != line_size) {
      const uint8_t zeroes[3] = { 0 };
      if (fwrite(zeroes, bmp_stride - line_size, 1, fout) != 1) {
        return 0;
      }
    }
    rgba += stride;
  }
  return 1;
}